

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O3

char * __thiscall dmlc::DateLogger::HumanDate(DateLogger *this)

{
  tm *ptVar1;
  time_t time_value;
  tm now;
  time_t local_48;
  tm local_40;
  
  local_48 = time((time_t *)0x0);
  ptVar1 = localtime_r(&local_48,&local_40);
  snprintf(this->buffer_,9,"%02d:%02d:%02d",(ulong)(uint)ptVar1->tm_hour,(ulong)(uint)ptVar1->tm_min
           ,(ulong)(uint)ptVar1->tm_sec);
  return this->buffer_;
}

Assistant:

const char *HumanDate() {
#ifndef _LIBCPP_SGX_CONFIG
#if defined(_MSC_VER)
    _strtime_s(buffer_, sizeof(buffer_));
#else
    time_t time_value = time(NULL);
    struct tm *pnow;
#if !defined(_WIN32)
    struct tm now;
    pnow = localtime_r(&time_value, &now);
#else
    pnow = localtime(&time_value); // NOLINT(*)
#endif
    snprintf(buffer_, sizeof(buffer_), "%02d:%02d:%02d",
             pnow->tm_hour, pnow->tm_min, pnow->tm_sec);
#endif
#endif // _LIBCPP_SGX_CONFIG
    return buffer_;
  }